

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbdl_mathutils.cc
# Opt level: O2

void RigidBodyDynamics::Math::SpatialMatrixSetSubmatrix
               (SpatialMatrix *dest,uint row,uint col,Matrix3d *matrix)

{
  ulong uVar1;
  uint uVar2;
  uint uVar3;
  
  uVar1 = (ulong)(row * 3);
  (dest->super_Matrix<double,_6,_6,_0,_6,_6>).
  super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array
  [(ulong)(col * 3) * 6 + uVar1] =
       (matrix->super_Matrix3d).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
       m_storage.m_data.array[0];
  uVar3 = col * 3 + 1;
  (dest->super_Matrix<double,_6,_6,_0,_6,_6>).
  super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array
  [(ulong)uVar3 * 6 + uVar1] =
       (matrix->super_Matrix3d).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
       m_storage.m_data.array[3];
  uVar2 = col * 3 + 2;
  (dest->super_Matrix<double,_6,_6,_0,_6,_6>).
  super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array
  [(ulong)uVar2 * 6 + uVar1] =
       (matrix->super_Matrix3d).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
       m_storage.m_data.array[6];
  uVar1 = (ulong)(row * 3 + 1);
  (dest->super_Matrix<double,_6,_6,_0,_6,_6>).
  super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array
  [(ulong)(col * 3) * 6 + uVar1] =
       (matrix->super_Matrix3d).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
       m_storage.m_data.array[1];
  (dest->super_Matrix<double,_6,_6,_0,_6,_6>).
  super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array
  [(ulong)uVar3 * 6 + uVar1] =
       (matrix->super_Matrix3d).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
       m_storage.m_data.array[4];
  (dest->super_Matrix<double,_6,_6,_0,_6,_6>).
  super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array
  [(ulong)uVar2 * 6 + uVar1] =
       (matrix->super_Matrix3d).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
       m_storage.m_data.array[7];
  uVar1 = (ulong)(row * 3 + 2);
  (dest->super_Matrix<double,_6,_6,_0,_6,_6>).
  super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array
  [(ulong)(col * 3) * 6 + uVar1] =
       (matrix->super_Matrix3d).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
       m_storage.m_data.array[2];
  (dest->super_Matrix<double,_6,_6,_0,_6,_6>).
  super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array
  [(ulong)uVar3 * 6 + uVar1] =
       (matrix->super_Matrix3d).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
       m_storage.m_data.array[5];
  (dest->super_Matrix<double,_6,_6,_0,_6,_6>).
  super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array
  [(ulong)uVar2 * 6 + uVar1] =
       (matrix->super_Matrix3d).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
       m_storage.m_data.array[8];
  return;
}

Assistant:

RBDL_DLLAPI void SpatialMatrixSetSubmatrix(
    SpatialMatrix &dest, 
    unsigned int row, 
    unsigned int col, 
    const Matrix3d &matrix) {
  assert (row < 2 && col < 2);

  dest(row*3,col*3) = matrix(0,0);
  dest(row*3,col*3 + 1) = matrix(0,1);
  dest(row*3,col*3 + 2) = matrix(0,2);

  dest(row*3 + 1,col*3) = matrix(1,0);
  dest(row*3 + 1,col*3 + 1) = matrix(1,1);
  dest(row*3 + 1,col*3 + 2) = matrix(1,2);

  dest(row*3 + 2,col*3) = matrix(2,0);
  dest(row*3 + 2,col*3 + 1) = matrix(2,1);
  dest(row*3 + 2,col*3 + 2) = matrix(2,2);
}